

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v6::internal::
     handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<int,fmt::v6::basic_format_specs<wchar_t>>>
               (char spec,int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_> *handler)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,spec);
  if (iVar1 < 100) {
    if (iVar1 < 0x58) {
      if (iVar1 == 0) {
LAB_00178fe9:
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_dec(handler);
        return;
      }
      if (iVar1 == 0x42) {
LAB_00178fcf:
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_bin(handler);
        return;
      }
    }
    else {
      if (iVar1 == 0x58) {
LAB_00178fe1:
        basic_writer<fmt::v6::buffer_range<wchar_t>_>::
        int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_hex(handler);
        return;
      }
      if (iVar1 == 0x62) goto LAB_00178fcf;
    }
  }
  else if (iVar1 < 0x6f) {
    if (iVar1 == 100) goto LAB_00178fe9;
    if (iVar1 == 0x6e) {
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_num(handler);
      return;
    }
  }
  else {
    if (iVar1 == 0x6f) {
      basic_writer<fmt::v6::buffer_range<wchar_t>_>::
      int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_oct(handler);
      return;
    }
    if (iVar1 == 0x78) goto LAB_00178fe1;
  }
  basic_writer<fmt::v6::buffer_range<wchar_t>_>::
  int_writer<int,_fmt::v6::basic_format_specs<wchar_t>_>::on_error(handler);
}

Assistant:

FMT_CONSTEXPR void handle_int_type_spec(char spec, Handler&& handler) {
  switch (spec) {
  case 0:
  case 'd':
    handler.on_dec();
    break;
  case 'x':
  case 'X':
    handler.on_hex();
    break;
  case 'b':
  case 'B':
    handler.on_bin();
    break;
  case 'o':
    handler.on_oct();
    break;
  case 'n':
    handler.on_num();
    break;
  default:
    handler.on_error();
  }
}